

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgecko.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  double dVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  ostream *poVar9;
  long *plVar10;
  uint uVar11;
  int extraout_EDX;
  int extraout_EDX_00;
  int columns;
  int columns_00;
  int columns_01;
  Index i;
  uint uVar12;
  bool bVar13;
  uint uVar14;
  char *pcVar15;
  long lVar16;
  uint nodes;
  uint uVar17;
  ulong uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  string error_2;
  size_type __dnew_2;
  uint maxsize;
  uint maxdims;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type __dnew;
  string error;
  Graph graph;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  float local_308;
  float local_304;
  uint local_300;
  uint local_2fc;
  undefined1 local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  ulong local_258;
  ulong local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [40];
  pointer local_1e0;
  pointer local_1d8;
  pointer local_1c8;
  pointer local_1c0;
  pointer local_1b0;
  pointer local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_2fc = 5;
  local_300 = 6;
  if ((argc != 1) &&
     (((argc != 2 && ((argc != 3 || (iVar6 = sscanf(argv[2],"%u",&local_300), iVar6 != 1)))) ||
      (iVar6 = sscanf(argv[1],"%u",&local_2fc), iVar6 != 1)))) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Usage: testgecko [maxdims [maxsize]]",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    return 1;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"library version test","");
  pcVar15 = Gecko::version_string;
  if (Gecko::version_string == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108158);
  }
  else {
    sVar8 = strlen(Gecko::version_string);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar15,sVar8);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"library version ",0x10);
  lVar16 = std::cerr;
  *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
       *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) | 0x200;
  *(uint *)(__cxa_finalize + *(long *)(lVar16 + -0x18)) =
       *(uint *)(__cxa_finalize + *(long *)(lVar16 + -0x18)) & 0xffffffb5 | 8;
  iVar6 = (int)Gecko::version;
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  lVar16 = *(long *)poVar9;
  lVar3 = *(long *)(lVar16 + -0x18);
  *(uint *)(poVar9 + lVar3 + 0x18) = *(uint *)(poVar9 + lVar3 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar16 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  paVar2 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar2;
  if (iVar6 == 0x100) {
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    iVar6 = extraout_EDX;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"header and binary version mismatch","");
    iVar6 = extraout_EDX_00;
  }
  iVar6 = report(&local_50,&local_110,iVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  Gecko::Graph::Graph((Graph *)local_208,0x10000);
  uVar11 = 0;
  do {
    uVar14 = uVar11 + 1;
    uVar17 = (uint)(Graph *)local_208;
    if (1 < uVar14) {
      Gecko::Graph::insert_arc(uVar17,uVar14,1.0,1.0);
    }
    if (uVar11 != 0xffff) {
      Gecko::Graph::insert_arc(uVar17,uVar14,1.0,1.0);
    }
    uVar11 = uVar14;
  } while (uVar14 != 0x10000);
  if (((long)local_1d8 - (long)local_1e0 & 0xffffffff0U) == 0x100010) {
    if ((((ulong)((long)local_1c0 - (long)local_1c8) >> 2) + 0x1ffffffff & 0x1fffffffe) == 0x1fffe)
    {
      plVar10 = (long *)operator_new(8);
      *plVar10 = (long)&PTR__Functional_00106cf0;
      Gecko::Graph::order((Functional *)local_208,(uint)plVar10,1,4,0,(Progress *)0x1);
      (**(code **)(*plVar10 + 8))(plVar10);
      lVar16 = 1;
      do {
        if (lVar16 == 0x10000) {
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          local_298._M_string_length = 0;
          local_298.field_2._M_allocated_capacity =
               local_298.field_2._M_allocated_capacity & 0xffffffffffffff00;
          goto LAB_00102a32;
        }
        uVar11 = ((pointer)(local_208._16_8_ - 4))[lVar16];
        uVar14 = *(uint *)(local_208._16_8_ + lVar16 * 4);
        iVar7 = Gecko::Graph::arc_index((uint)local_208,uVar11);
        lVar16 = lVar16 + 1;
      } while (iVar7 != 0);
      local_278.field_2._M_allocated_capacity._0_2_ = 0x7b;
      local_278._M_string_length = 1;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      stringize<unsigned_int>(&local_348,uVar11);
      std::operator+(&local_228,&local_278,&local_348);
      local_178.field_2._M_allocated_capacity._0_2_ = 0x202c;
      local_178._M_string_length = 2;
      local_178.field_2._M_local_buf[2] = '\0';
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                     &local_228,&local_178);
      stringize<unsigned_int>(&local_150,uVar14);
      std::operator+(&local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                     &local_150);
      local_328._M_dataplus._M_p = (pointer)0x10;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_248._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_248,(ulong)&local_328);
      local_248.field_2._M_allocated_capacity = (size_type)local_328._M_dataplus._M_p;
      builtin_strncpy(local_248._M_dataplus._M_p,"} is not an edge",0x10);
      local_248._M_string_length = (size_type)local_328._M_dataplus._M_p;
      local_248._M_dataplus._M_p[(long)local_328._M_dataplus._M_p] = '\0';
      std::operator+(&local_298,&local_2d8,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((Functional *)local_2f8._0_8_ != (Functional *)(local_2f8 + 0x10)) {
        operator_delete((void *)local_2f8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      goto LAB_00102a32;
    }
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    local_2d8._M_dataplus._M_p = (pointer)0x14;
    local_298._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_298,(ulong)&local_2d8);
    uVar19._0_1_ = 't';
    uVar19._1_1_ = ' ';
    uVar19._2_1_ = 'e';
    uVar19._3_1_ = 'd';
    uVar22._0_1_ = 'g';
    uVar22._1_1_ = 'e';
    uVar22._2_1_ = ' ';
    uVar22._3_1_ = 'c';
  }
  else {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    local_2d8._M_dataplus._M_p = (pointer)0x14;
    local_298._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_298,(ulong)&local_2d8);
    uVar19._0_1_ = 't';
    uVar19._1_1_ = ' ';
    uVar19._2_1_ = 'n';
    uVar19._3_1_ = 'o';
    uVar22._0_1_ = 'd';
    uVar22._1_1_ = 'e';
    uVar22._2_1_ = ' ';
    uVar22._3_1_ = 'c';
  }
  *(undefined4 *)local_298._M_dataplus._M_p = 0x6f636e69;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 4) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 5) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 6) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 7) = 'c';
  *(undefined4 *)(local_298._M_dataplus._M_p + 8) = uVar19;
  *(undefined4 *)(local_298._M_dataplus._M_p + 0xc) = uVar22;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 0x10) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 0x11) = 'u';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 0x12) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p + 0x13) = 't';
  local_298._M_string_length = (size_type)local_2d8._M_dataplus._M_p;
  local_298._M_dataplus._M_p[(long)local_2d8._M_dataplus._M_p] = '\0';
  local_298.field_2._M_allocated_capacity = (size_type)local_2d8._M_dataplus._M_p;
LAB_00102a32:
  if (local_198 != (pointer)0x0) {
    operator_delete(local_198);
  }
  if (local_1b0 != (pointer)0x0) {
    operator_delete(local_1b0);
  }
  if (local_1c8 != (pointer)0x0) {
    operator_delete(local_1c8);
  }
  if (local_1e0 != (pointer)0x0) {
    operator_delete(local_1e0);
  }
  if ((pointer)local_208._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._16_8_);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"path graph test","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_298._M_dataplus._M_p,
             local_298._M_string_length + local_298._M_dataplus._M_p);
  iVar7 = report(&local_70,&local_90,columns);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  iVar7 = iVar7 + iVar6;
  if (local_2fc != 0) {
    uVar11 = 1;
    do {
      nodes = 1 << ((byte)uVar11 & 0x1f);
      Gecko::Graph::Graph((Graph *)local_208,nodes);
      uVar14 = 1;
      bVar13 = false;
      do {
        if (uVar11 != 0) {
          uVar17 = 0;
          do {
            iVar6 = Gecko::Graph::insert_arc((uint)local_208,uVar14,1.0,1.0);
            if (iVar6 == 0) {
              local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
              local_2d8._M_dataplus._M_p = (pointer)0x14;
              local_328._M_dataplus._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_2d8);
              local_328.field_2._M_allocated_capacity = (size_type)local_2d8._M_dataplus._M_p;
              *(undefined8 *)local_328._M_dataplus._M_p = 0x65736e6920637261;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 8) = 'r';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 9) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 10) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 0xb) = 'o';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 0xc) = 'n';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 0xd) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 0xe) = 'f';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 0xf) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 0x10) = 'i';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 0x11) = 'l';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 0x12) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_328._M_dataplus._M_p + 0x13) = 'd';
              local_328._M_string_length = (size_type)local_2d8._M_dataplus._M_p;
              local_328._M_dataplus._M_p[(long)local_2d8._M_dataplus._M_p] = '\0';
              if (bVar13) goto LAB_00102c20;
              goto LAB_00102fa5;
            }
            uVar17 = uVar17 + 1;
          } while (uVar11 != uVar17);
        }
        uVar14 = uVar14 + 1;
        bVar13 = nodes < uVar14;
      } while (uVar14 <= nodes);
LAB_00102c20:
      if ((int)((ulong)((long)local_1d8 - (long)local_1e0) >> 4) - 1U == nodes) {
        if ((uVar11 << ((byte)uVar11 & 0x1f)) >> 1 !=
            (uint)(((ulong)((long)local_1c0 - (long)local_1c8) >> 2) + 0x1ffffffff >> 1)) {
          local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
          local_2d8._M_dataplus._M_p = (pointer)0x14;
          local_328._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_2d8);
          uVar20._0_1_ = 't';
          uVar20._1_1_ = ' ';
          uVar20._2_1_ = 'e';
          uVar20._3_1_ = 'd';
          uVar23._0_1_ = 'g';
          uVar23._1_1_ = 'e';
          uVar23._2_1_ = ' ';
          uVar23._3_1_ = 'c';
          goto LAB_00102f8c;
        }
        plVar10 = (long *)operator_new(8);
        *plVar10 = (long)&PTR__Functional_00106cf0;
        Gecko::Graph::order((Functional *)local_208,(uint)plVar10,4,6,1,(Progress *)0x1);
        (**(code **)(*plVar10 + 8))(plVar10);
        uVar18 = 0;
        do {
          if (nodes - 1 == uVar18) {
            local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
            local_328._M_string_length = 0;
            local_328.field_2._M_allocated_capacity =
                 local_328.field_2._M_allocated_capacity & 0xffffffffffffff00;
            goto LAB_00102fa5;
          }
          uVar14 = *(uint *)(local_208._16_8_ + uVar18 * 4);
          uVar17 = ((pointer)(local_208._16_8_ + 4))[uVar18];
          iVar6 = Gecko::Graph::arc_index((uint)local_208,uVar14);
          uVar18 = uVar18 + 1;
        } while (iVar6 != 0);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        local_278.field_2._M_allocated_capacity._0_2_ = 0x7b;
        local_278._M_string_length = 1;
        stringize<unsigned_int>(&local_348,uVar14);
        std::operator+(&local_228,&local_278,&local_348);
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        local_178.field_2._M_allocated_capacity._0_2_ = 0x202c;
        local_178._M_string_length = 2;
        local_178.field_2._M_local_buf[2] = '\0';
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f8,&local_228,&local_178);
        stringize<unsigned_int>(&local_150,uVar17);
        std::operator+(&local_2d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2f8,&local_150);
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x10;
        local_248._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_248,(ulong)&local_158);
        local_248.field_2._M_allocated_capacity = (size_type)local_158;
        builtin_strncpy(local_248._M_dataplus._M_p,"} is not an edge",0x10);
        local_248._M_string_length = (size_type)local_158;
        local_248._M_dataplus._M_p[(long)local_158] = '\0';
        std::operator+(&local_328,&local_2d8,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((Functional *)local_2f8._0_8_ != (Functional *)(local_2f8 + 0x10)) {
          operator_delete((void *)local_2f8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p);
        }
      }
      else {
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        local_2d8._M_dataplus._M_p = (pointer)0x14;
        local_328._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_328,(ulong)&local_2d8);
        uVar20._0_1_ = 't';
        uVar20._1_1_ = ' ';
        uVar20._2_1_ = 'n';
        uVar20._3_1_ = 'o';
        uVar23._0_1_ = 'd';
        uVar23._1_1_ = 'e';
        uVar23._2_1_ = ' ';
        uVar23._3_1_ = 'c';
LAB_00102f8c:
        *(undefined4 *)local_328._M_dataplus._M_p = 0x6f636e69;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p + 4) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p + 5) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p + 6) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p + 7) = 'c';
        *(undefined4 *)(local_328._M_dataplus._M_p + 8) = uVar20;
        *(undefined4 *)(local_328._M_dataplus._M_p + 0xc) = uVar23;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p + 0x10) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p + 0x11) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p + 0x12) = 'n';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_328._M_dataplus._M_p + 0x13) = 't';
        local_328._M_string_length = (size_type)local_2d8._M_dataplus._M_p;
        local_328._M_dataplus._M_p[(long)local_2d8._M_dataplus._M_p] = '\0';
        local_328.field_2._M_allocated_capacity = (size_type)local_2d8._M_dataplus._M_p;
      }
LAB_00102fa5:
      if (local_198 != (pointer)0x0) {
        operator_delete(local_198);
      }
      if (local_1b0 != (pointer)0x0) {
        operator_delete(local_1b0);
      }
      if (local_1c8 != (pointer)0x0) {
        operator_delete(local_1c8);
      }
      if (local_1e0 != (pointer)0x0) {
        operator_delete(local_1e0);
      }
      if ((pointer)local_208._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_208._16_8_);
      }
      local_208._0_8_ = (Functional *)(local_208 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"hypercube test #","");
      stringize<unsigned_int>(&local_2d8,uVar11);
      std::operator+(&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_2d8);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_328._M_dataplus._M_p,
                 local_328._M_string_length + local_328._M_dataplus._M_p);
      iVar6 = report(&local_b0,&local_d0,columns_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if ((Functional *)local_208._0_8_ != (Functional *)(local_208 + 0x10)) {
        operator_delete((void *)local_208._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p);
      }
      iVar7 = iVar7 + iVar6;
      uVar11 = uVar11 + 1;
    } while (uVar11 <= local_2fc);
  }
  if (local_300 != 0) {
    uVar11 = 1;
    local_258 = 2;
    local_250 = 0;
    do {
      local_2d8._M_dataplus._M_p = (pointer)0x0;
      local_2d8._M_string_length = 0x3ff0000000000000;
      local_2d8.field_2._M_allocated_capacity = 0x4008000000000000;
      local_2d8.field_2._8_8_ = 0x406c200000000000;
      local_2b8 = 0x4125061200000000;
      uStack_2b0 = 0x4240fc49c2668000;
      local_2a8 = 0x43ab53e135c9de4c;
      if (uVar11 < 8) {
        uVar14 = uVar11 - 1;
        fVar5 = (float)(uVar11 * uVar14 * 2);
        if (fVar5 == 0.0) {
          local_308 = 0.0;
        }
        else {
          dVar4 = log((double)(&local_2d8._M_dataplus)[uVar11]._M_p);
          dVar4 = exp(dVar4 / (double)(uint)fVar5);
          local_308 = (float)dVar4;
        }
        local_304 = fVar5;
        Gecko::Graph::Graph((Graph *)local_208,0);
        if ((ulong)uVar11 != 0) {
          uVar17 = 0;
          do {
            Gecko::Graph::insert_node(1.0);
            uVar1 = uVar17 + 1;
            if (uVar17 % uVar11 != 0) {
              Gecko::Graph::insert_arc((uint)local_208,uVar1,1.0,1.0);
            }
            if (uVar17 % uVar11 < uVar14) {
              Gecko::Graph::insert_arc((uint)local_208,uVar1,1.0,1.0);
            }
            if (uVar11 <= uVar17) {
              Gecko::Graph::insert_arc((uint)local_208,uVar1,1.0,1.0);
            }
            if (uVar17 / uVar11 < uVar14) {
              Gecko::Graph::insert_arc((uint)local_208,uVar1,1.0,1.0);
            }
            uVar12 = uVar17 + 2;
            uVar17 = uVar1;
          } while (uVar12 <= uVar11 * uVar11);
        }
        if ((int)((ulong)((long)local_1d8 - (long)local_1e0) >> 4) - 1U == uVar11 * uVar11) {
          if (local_304 !=
              (float)(((ulong)((long)local_1c0 - (long)local_1c8) >> 2) + 0x1ffffffff >> 1)) {
            local_2f8._0_8_ = (Functional *)0x14;
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
            local_348._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)local_2f8);
            uVar21._0_1_ = 't';
            uVar21._1_1_ = ' ';
            uVar21._2_1_ = 'e';
            uVar21._3_1_ = 'd';
            uVar24._0_1_ = 'g';
            uVar24._1_1_ = 'e';
            uVar24._2_1_ = ' ';
            uVar24._3_1_ = 'c';
            goto LAB_001035a8;
          }
          plVar10 = (long *)operator_new(8);
          *plVar10 = (long)&PTR__Functional_00106cf0;
          Gecko::Graph::order((Functional *)local_208,(uint)plVar10,9,5,2,(Progress *)0x1);
          local_304 = (float)Gecko::Graph::cost();
          (**(code **)(*plVar10 + 8))(plVar10);
          if (local_304 <= local_308 * 1.01) {
            local_348._M_string_length = 0;
            local_348.field_2._M_allocated_capacity =
                 local_348.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          }
          else {
            stringize<float>(&local_228,local_304);
            local_2f8._0_8_ = local_2f8 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2f8,local_228._M_dataplus._M_p,
                       local_228._M_dataplus._M_p + local_228._M_string_length);
            std::__cxx11::string::append((char *)local_2f8);
            stringize<float>(&local_278,local_308);
            std::operator+(&local_348,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2f8,&local_278);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p);
            }
            if ((Functional *)local_2f8._0_8_ != (Functional *)(local_2f8 + 0x10)) {
              operator_delete((void *)local_2f8._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p);
            }
          }
        }
        else {
          local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
          local_2f8._0_8_ = (Functional *)0x14;
          local_348._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)local_2f8);
          uVar21._0_1_ = 't';
          uVar21._1_1_ = ' ';
          uVar21._2_1_ = 'n';
          uVar21._3_1_ = 'o';
          uVar24._0_1_ = 'd';
          uVar24._1_1_ = 'e';
          uVar24._2_1_ = ' ';
          uVar24._3_1_ = 'c';
LAB_001035a8:
          *(undefined4 *)local_348._M_dataplus._M_p = 0x6f636e69;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p + 4) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p + 5) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p + 6) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p + 7) = 'c';
          *(undefined4 *)(local_348._M_dataplus._M_p + 8) = uVar21;
          *(undefined4 *)(local_348._M_dataplus._M_p + 0xc) = uVar24;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p + 0x10) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p + 0x11) = 'u';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p + 0x12) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p + 0x13) = 't';
          local_348._M_string_length = local_2f8._0_8_;
          local_348._M_dataplus._M_p[local_2f8._0_8_] = '\0';
          local_348.field_2._M_allocated_capacity = local_2f8._0_8_;
        }
        if (local_198 != (pointer)0x0) {
          operator_delete(local_198);
        }
        if (local_1b0 != (pointer)0x0) {
          operator_delete(local_1b0);
        }
        if (local_1c8 != (pointer)0x0) {
          operator_delete(local_1c8);
        }
        if (local_1e0 != (pointer)0x0) {
          operator_delete(local_1e0);
        }
        if ((pointer)local_208._16_8_ != (pointer)0x0) {
          operator_delete((void *)local_208._16_8_);
        }
      }
      else {
        local_208._0_8_ = (Functional *)0x1e;
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        local_348._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_348,(ulong)local_208);
        local_348.field_2._M_allocated_capacity = local_208._0_8_;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0xe) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0xf) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x10) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x11) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x12) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x13) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x14) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x15) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x16) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x17) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x18) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x19) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x1a) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x1b) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x1c) = 'z';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0x1d) = 'e';
        *(undefined8 *)local_348._M_dataplus._M_p = 0x7a69732064697267;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 8) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 9) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0xb) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0xc) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0xd) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0xe) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_348._M_dataplus._M_p + 0xf) = 'd';
        local_348._M_string_length = local_208._0_8_;
        local_348._M_dataplus._M_p[local_208._0_8_] = '\0';
      }
      local_208._0_8_ = (Functional *)(local_208 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"grid test #","");
      stringize<unsigned_int>(&local_2d8,uVar11);
      std::operator+(&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                     &local_2d8);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_348._M_dataplus._M_p,
                 local_348._M_dataplus._M_p + (long)(_func_int ***)local_348._M_string_length);
      iVar6 = report(&local_f0,&local_130,columns_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      if ((Functional *)local_208._0_8_ != (Functional *)(local_208 + 0x10)) {
        operator_delete((void *)local_208._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      iVar7 = iVar7 + iVar6;
      uVar11 = uVar11 + 1;
      local_258 = (ulong)((int)local_258 + 1);
      local_250 = (ulong)((int)local_250 - 1);
    } while (uVar11 <= local_300);
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  if (iVar7 == 0) {
    poVar9 = (ostream *)&std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"all tests passed",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
  }
  else {
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," test",5);
    pcVar15 = "";
    if (iVar7 != 1) {
      pcVar15 = "s";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,(ulong)(iVar7 != 1));
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," of ",4);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," failed",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  }
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  return (uint)(iVar7 != 0);
}

Assistant:

int main(int argc, char* argv[])
{
  uint tests = 0;    // number of tests performed
  uint failures = 0; // number of failed tests
  uint maxdims = 5;  // number of hypercube dimensions
  uint maxsize = 6;  // max grid dimensions

  switch (argc) {
    case 3:
      if (sscanf(argv[2], "%u", &maxsize) != 1)
        goto usage;
      // FALLTHROUGH
    case 2:
      if (sscanf(argv[1], "%u", &maxdims) != 1)
        goto usage;
      // FALLTHROUGH
    case 1:
      break;
    default:
    usage:
      std::cerr << "Usage: testgecko [maxdims [maxsize]]" << std::endl;
      return EXIT_FAILURE;
  }

  // print version info and ensure header matches binary
  failures += report("library version test", init() ? std::string() : std::string("header and binary version mismatch"));
  tests++;

  // order path
  std::string error = path_test();
  failures += report("path graph test", error);
  tests++;

  // order hypercubes
  for (uint dims = 1; dims <= maxdims; dims++) {
    std::string error = hypercube_test(dims);
    failures += report(std::string("hypercube test #") + stringize(dims), error);
    tests++;
  }

  // order grids
  for (uint size = 1; size <= maxsize; size++) {
    std::string error = grid_test(size);
    failures += report(std::string("grid test #") + stringize(size), error);
    tests++;
  }

  // summarize tests
  return finish(failures, tests);
}